

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

void charmap_Add(char *mapping,uint8_t value)

{
  byte bVar1;
  size_t sVar2;
  Charmap *pCVar3;
  Charmap *pCVar4;
  Charmap **map;
  
  pCVar3 = *currentCharmap;
  pCVar4 = pCVar3 + 1;
  map = currentCharmap;
  for (; *mapping != '\0'; mapping = mapping + 1) {
    bVar1 = *mapping - 1;
    if ((&pCVar4->usedNodes)[bVar1] == 0) {
      sVar2 = pCVar3->usedNodes;
      (&pCVar4->usedNodes)[bVar1] = sVar2;
      if (sVar2 == pCVar3->capacity) {
        pCVar3->capacity = sVar2 * 2;
        resizeCharmap(map,sVar2 * 2);
        pCVar3 = *currentCharmap;
        sVar2 = pCVar3->usedNodes;
        map = currentCharmap;
      }
      pCVar3->usedNodes = sVar2 + 1;
      pCVar4 = (Charmap *)((long)pCVar3 + sVar2 * 0x800 + 0x18);
      *(undefined1 *)&pCVar4->name = 0;
      memset((void *)((long)pCVar3 + sVar2 * 0x800 + 0x20),0,0x7f8);
    }
    else {
      pCVar4 = (Charmap *)((long)pCVar3 + (&pCVar4->usedNodes)[bVar1] * 0x800 + 0x18);
    }
  }
  if (*(char *)&pCVar4->name != '\0') {
    warning(WARNING_CHARMAP_REDEF,"Overriding charmap mapping\n");
  }
  *(undefined1 *)&pCVar4->name = 1;
  *(uint8_t *)((long)&pCVar4->name + 1) = value;
  return;
}

Assistant:

void charmap_Add(char *mapping, uint8_t value)
{
	struct Charmap *charmap = *currentCharmap;
	struct Charnode *node = &charmap->nodes[0];

	for (uint8_t c; *mapping; mapping++) {
		c = *mapping - 1;

		if (node->next[c]) {
			node = &charmap->nodes[node->next[c]];
		} else {
			// Register next available node
			node->next[c] = charmap->usedNodes;
			// If no more nodes are available, get new ones
			if (charmap->usedNodes == charmap->capacity) {
				charmap->capacity *= 2;
				resizeCharmap(currentCharmap, charmap->capacity);
				charmap = *currentCharmap;
			}

			// Switch to and init new node
			node = &charmap->nodes[charmap->usedNodes++];
			initNode(node);
		}
	}

	if (node->isTerminal)
		warning(WARNING_CHARMAP_REDEF, "Overriding charmap mapping\n");

	node->isTerminal = true;
	node->value = value;
}